

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O0

uint dic::murmurhash2(void *key)

{
  uint uVar1;
  size_t sVar2;
  int *piStack_30;
  uint k;
  char *data;
  int local_20;
  uint h;
  int len;
  int r;
  uint m;
  uint seed;
  void *key_local;
  
  sVar2 = strlen(*(char **)((long)key + 8));
  local_20 = (int)sVar2;
  data._4_4_ = local_20 * 0xabcd;
  piStack_30 = *(int **)((long)key + 8);
  for (; 3 < local_20; local_20 = local_20 + -4) {
    data._4_4_ = ((uint)(*piStack_30 * 0x5bd1e995) >> 0x18 ^ *piStack_30 * 0x5bd1e995) * 0x5bd1e995
                 ^ data._4_4_ * 0x5bd1e995;
    piStack_30 = piStack_30 + 1;
  }
  if (local_20 != 1) {
    if (local_20 != 2) {
      if (local_20 != 3) goto LAB_0011662a;
      data._4_4_ = (int)*(char *)((long)piStack_30 + 2) << 0x10 ^ data._4_4_;
    }
    data._4_4_ = (int)*(char *)((long)piStack_30 + 1) << 8 ^ data._4_4_;
  }
  data._4_4_ = ((int)(char)*piStack_30 ^ data._4_4_) * 0x5bd1e995;
LAB_0011662a:
  uVar1 = (data._4_4_ >> 0xd ^ data._4_4_) * 0x5bd1e995;
  return uVar1 >> 0xf ^ uVar1;
}

Assistant:

unsigned int dic::murmurhash2(const void *key){

    const unsigned int seed=0xabcd;
    const unsigned int m=0x5bd1e995;
    const int r=24;

    int len=strlen((const char *)((const robj *)key)->ptr);

    unsigned int h=seed*len;

    const char *data=(const char *)((const robj *)key)->ptr;

    while(len>=4){
        unsigned int k=*(unsigned int *)data;

        k*=m;
        k^=k>>r;
        k*=m;

        h*=m;
        h^=k;

        data+=4;
        len-=4;
    }

    switch(len){
        case 3:h^=data[2]<<16;
        case 2:h^=data[1]<<8;
        case 1:h^=data[0];
               h*=m;
    };

    h^=h>>13;
    h*=m;
    h^=h>>15;

    return h;
}